

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolNumIters(SUNLinearSolver S,int myid)

{
  uint uVar1;
  int in_ESI;
  undefined8 in_RDI;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int numiters;
  
  dVar2 = get_time();
  uVar1 = SUNLinSolNumIters(in_RDI);
  sync_device();
  dVar3 = get_time();
  if ((in_ESI == 0) &&
     (printf("    PASSED test -- SUNLinSolNumIters (%d) \n",(ulong)uVar1), print_time != 0)) {
    printf("    SUNLinSolNumIters Time: %22.15e \n \n",dVar3 - dVar2);
  }
  return 0;
}

Assistant:

int Test_SUNLinSolNumIters(SUNLinearSolver S, int myid)
{
  int numiters;
  double start_time, stop_time;

  /* the only way to fail this test is if the function is NULL,
     which will cause a seg-fault */
  start_time = get_time();
  numiters   = SUNLinSolNumIters(S);
  sync_device();
  stop_time = get_time();

  if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolNumIters (%d) \n", numiters);
    PRINT_TIME("    SUNLinSolNumIters Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}